

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_iter.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_224a1::
ARTIteratorTest_singleLeafSeek_Test<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTIteratorTest_singleLeafSeek_Test<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  __extent_storage<18446744073709551615UL> *tree;
  undefined8 uVar1;
  iterator *piVar2;
  long lVar3;
  iter_difference_t<const_std::byte_*> __d1;
  char *pcVar4;
  char *expected_predicate_value;
  internal iVar5;
  bool bVar6;
  key_view kVar7;
  value_view vVar8;
  value_view v;
  undefined1 local_2e8 [8];
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  verifier;
  iterator e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  AssertHelper local_40;
  AssertHelper local_38;
  bool local_29 [8];
  bool match;
  
  unodb::test::
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::tree_verifier((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                   *)local_2e8,false);
  kVar7 = unodb::test::
          tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::make_key((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                      *)local_2e8,1);
  expected_predicate_value = (char *)0x0;
  v._M_extent._M_extent_value = 2;
  v._M_ptr = &unodb::test::test_value_2;
  unodb::test::
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert_internal((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                     *)local_2e8,kVar7,v,false);
  tree = &verifier.unused_key._M_extent;
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::iterator
            ((iterator *)
             &verifier.key_views.
              super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              *)tree);
  local_29[0] = false;
  kVar7 = unodb::test::
          tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::make_key((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                      *)local_2e8,1);
  piVar2 = unodb::
           db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
           ::iterator::seek((iterator *)
                            &verifier.key_views.
                             super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,(art_key_type)kVar7,
                            local_29,true);
  iVar5 = (internal)
          ((piVar2->stack_).c.
           super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          (piVar2->stack_).c.
          super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur);
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)iVar5) {
    local_50._M_head_impl._0_1_ = iVar5;
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&e.keybuf_.off,(internal *)&local_50,(AssertionResult *)"it.valid()",
               "false","true",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x140,(char *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off) != &local_60) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off),
                      local_60._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  local_50._M_head_impl._0_1_ = (internal)0x1;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&e.keybuf_.off,"(match)","(true)",local_29,(bool *)&local_50);
  if ((char)e.keybuf_.off == '\0') {
    testing::Message::Message((Message *)&local_50);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x141,pcVar4);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  kVar7 = unodb::
          db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          ::iterator::get_key(piVar2);
  uVar1 = *(undefined8 *)kVar7._M_ptr;
  local_50._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)uVar1 >> 0x38 | (ulong)(uVar1 & 0xff000000000000) >> 0x28 |
        (ulong)(uVar1 & 0xff0000000000) >> 0x18 | (ulong)(uVar1 & 0xff00000000) >> 8 |
        (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28 |
       uVar1 << 0x38);
  local_38.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&e.keybuf_.off,"(decode(it.get_key()))","(1)",(unsigned_long *)&local_50,
             (int *)&local_38);
  if ((char)e.keybuf_.off == '\0') {
    testing::Message::Message((Message *)&local_50);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x142,pcVar4);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  vVar8 = unodb::
          db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          ::iterator::get_val(piVar2);
  if (vVar8._M_extent._M_extent_value._M_extent_value == 2) {
    lVar3 = 0;
    do {
      if (vVar8._M_ptr[lVar3] != (&unodb::test::test_value_2)[lVar3]) goto LAB_0015d34c;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 2);
  }
  else {
LAB_0015d34c:
    local_50._M_head_impl = local_50._M_head_impl & 0xffffffffffffff00;
    local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&e.keybuf_.off,(internal *)&local_50,
               (AssertionResult *)"std::ranges::equal(it.get_val(), unodb::test::test_values[1])",
               "false","true",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x144,(char *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off) != &local_60) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off),
                      local_60._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::next(piVar2);
  bVar6 = (piVar2->stack_).c.
          super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          (piVar2->stack_).c.
          super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_50._M_head_impl._0_1_ = (internal)bVar6;
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar6) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&e.keybuf_.off,(internal *)&local_50,(AssertionResult *)"it.valid()","true"
               ,"false",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x146,(char *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off) != &local_60) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off),
                      local_60._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  if ((byte *)0x100 < e.keybuf_.buf) {
    free((void *)e.keybuf_.ibuf._248_8_);
  }
  std::
  _Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
  ::~_Deque_base((_Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                  *)&e);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::iterator
            ((iterator *)
             &verifier.key_views.
              super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              *)tree);
  local_29[0] = false;
  kVar7 = unodb::test::
          tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::make_key((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                      *)local_2e8,1);
  piVar2 = unodb::
           db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
           ::iterator::seek((iterator *)
                            &verifier.key_views.
                             super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,(art_key_type)kVar7,
                            local_29,false);
  iVar5 = (internal)
          ((piVar2->stack_).c.
           super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          (piVar2->stack_).c.
          super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur);
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)iVar5) {
    local_50._M_head_impl._0_1_ = iVar5;
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&e.keybuf_.off,(internal *)&local_50,(AssertionResult *)"it.valid()",
               "false","true",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x14d,(char *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off) != &local_60) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off),
                      local_60._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  local_50._M_head_impl._0_1_ = (internal)local_29[0];
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_29[0] == false) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&e.keybuf_.off,(internal *)&local_50,(AssertionResult *)0x21b7a9,"false",
               "true",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x14e,(char *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off) != &local_60) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off),
                      local_60._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  kVar7 = unodb::
          db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          ::iterator::get_key(piVar2);
  uVar1 = *(undefined8 *)kVar7._M_ptr;
  local_50._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)uVar1 >> 0x38 | (ulong)(uVar1 & 0xff000000000000) >> 0x28 |
        (ulong)(uVar1 & 0xff0000000000) >> 0x18 | (ulong)(uVar1 & 0xff00000000) >> 8 |
        (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28 |
       uVar1 << 0x38);
  local_38.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&e.keybuf_.off,"(decode(it.get_key()))","(1)",(unsigned_long *)&local_50,
             (int *)&local_38);
  if ((char)e.keybuf_.off == '\0') {
    testing::Message::Message((Message *)&local_50);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x14f,pcVar4);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  vVar8 = unodb::
          db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          ::iterator::get_val(piVar2);
  if (vVar8._M_extent._M_extent_value._M_extent_value == 2) {
    lVar3 = 0;
    do {
      if (vVar8._M_ptr[lVar3] != (&unodb::test::test_value_2)[lVar3]) goto LAB_0015d74b;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 2);
  }
  else {
LAB_0015d74b:
    local_50._M_head_impl = local_50._M_head_impl & 0xffffffffffffff00;
    local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&e.keybuf_.off,(internal *)&local_50,
               (AssertionResult *)"std::ranges::equal(it.get_val(), unodb::test::test_values[1])",
               "false","true",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x151,(char *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off) != &local_60) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off),
                      local_60._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::next(piVar2);
  bVar6 = (piVar2->stack_).c.
          super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          (piVar2->stack_).c.
          super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_50._M_head_impl._0_1_ = (internal)bVar6;
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar6) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&e.keybuf_.off,(internal *)&local_50,(AssertionResult *)"it.valid()","true"
               ,"false",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x153,(char *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off) != &local_60) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off),
                      local_60._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  if ((byte *)0x100 < e.keybuf_.buf) {
    free((void *)e.keybuf_.ibuf._248_8_);
  }
  std::
  _Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
  ::~_Deque_base((_Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                  *)&e);
  local_29[0] = true;
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::iterator
            ((iterator *)
             &verifier.key_views.
              super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              *)tree);
  kVar7 = unodb::test::
          tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::make_key((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                      *)local_2e8,0);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::seek((iterator *)
                   &verifier.key_views.
                    super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(art_key_type)kVar7,local_29,
                   true);
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (e.stack_.c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_node ==
      (_Map_pointer)
      e.stack_.c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_map_size) {
    local_50._M_head_impl._0_1_ =
         (internal)
         (e.stack_.c.
          super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_node !=
         (_Map_pointer)
         e.stack_.c.
         super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
         ._M_impl.super__Deque_impl_data._M_map_size);
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&e.keybuf_.off,(internal *)&local_50,(AssertionResult *)"it.valid()",
               "false","true",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x15c,(char *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off) != &local_60) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off),
                      local_60._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  local_50._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (CONCAT71(local_50._M_head_impl._1_7_,local_29[0]) ^ 1);
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_29[0] != false) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&e.keybuf_.off,(internal *)&local_50,(AssertionResult *)0x21b7a9,"true",
               "false",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x15d,(char *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off) != &local_60) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off),
                      local_60._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  kVar7 = unodb::
          db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          ::iterator::get_key((iterator *)
                              &verifier.key_views.
                               super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  uVar1 = *(undefined8 *)kVar7._M_ptr;
  local_50._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)uVar1 >> 0x38 | (ulong)(uVar1 & 0xff000000000000) >> 0x28 |
        (ulong)(uVar1 & 0xff0000000000) >> 0x18 | (ulong)(uVar1 & 0xff00000000) >> 8 |
        (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28 |
       uVar1 << 0x38);
  local_38.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&e.keybuf_.off,"(decode(it.get_key()))","(1)",(unsigned_long *)&local_50,
             (int *)&local_38);
  if ((char)e.keybuf_.off == '\0') {
    testing::Message::Message((Message *)&local_50);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x15e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  vVar8 = unodb::
          db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          ::iterator::get_val((iterator *)
                              &verifier.key_views.
                               super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (vVar8._M_extent._M_extent_value._M_extent_value == 2) {
    lVar3 = 0;
    do {
      if (vVar8._M_ptr[lVar3] != (&unodb::test::test_value_2)[lVar3]) goto LAB_0015db5a;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 2);
  }
  else {
LAB_0015db5a:
    local_50._M_head_impl = local_50._M_head_impl & 0xffffffffffffff00;
    local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&e.keybuf_.off,(internal *)&local_50,
               (AssertionResult *)"std::ranges::equal(it.get_val(), unodb::test::test_values[1])",
               "false","true",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x160,(char *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off) != &local_60) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off),
                      local_60._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::next((iterator *)
                   &verifier.key_views.
                    super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_50._M_head_impl._0_1_ =
       (internal)
       (e.stack_.c.
        super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_node ==
       (_Map_pointer)
       e.stack_.c.
       super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
       ._M_impl.super__Deque_impl_data._M_map_size);
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (e.stack_.c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_node !=
      (_Map_pointer)
      e.stack_.c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_map_size) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&e.keybuf_.off,(internal *)&local_50,(AssertionResult *)"it.valid()","true"
               ,"false",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x162,(char *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off) != &local_60) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off),
                      local_60._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  if ((byte *)0x100 < e.keybuf_.buf) {
    free((void *)e.keybuf_.ibuf._248_8_);
  }
  std::
  _Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
  ::~_Deque_base((_Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                  *)&e);
  local_29[0] = true;
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::iterator
            ((iterator *)
             &verifier.key_views.
              super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              *)tree);
  kVar7 = unodb::test::
          tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::make_key((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                      *)local_2e8,2);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::seek((iterator *)
                   &verifier.key_views.
                    super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(art_key_type)kVar7,local_29,
                   true);
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (e.stack_.c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_node !=
      (_Map_pointer)
      e.stack_.c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_map_size) {
    local_50._M_head_impl._0_1_ =
         (internal)
         (e.stack_.c.
          super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_node ==
         (_Map_pointer)
         e.stack_.c.
         super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
         ._M_impl.super__Deque_impl_data._M_map_size);
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&e.keybuf_.off,(internal *)&local_50,(AssertionResult *)"it.valid()","true"
               ,"false",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x16a,(char *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off) != &local_60) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off),
                      local_60._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  local_50._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (CONCAT71(local_50._M_head_impl._1_7_,local_29[0]) ^ 1);
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_29[0] != false) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&e.keybuf_.off,(internal *)&local_50,(AssertionResult *)0x21b7a9,"true",
               "false",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x16b,(char *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off) != &local_60) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off),
                      local_60._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  if ((byte *)0x100 < e.keybuf_.buf) {
    free((void *)e.keybuf_.ibuf._248_8_);
  }
  std::
  _Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
  ::~_Deque_base((_Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                  *)&e);
  local_29[0] = true;
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::iterator
            ((iterator *)
             &verifier.key_views.
              super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              *)tree);
  kVar7 = unodb::test::
          tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::make_key((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                      *)local_2e8,0);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::seek((iterator *)
                   &verifier.key_views.
                    super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(art_key_type)kVar7,local_29,
                   false);
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (e.stack_.c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_node !=
      (_Map_pointer)
      e.stack_.c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_map_size) {
    local_50._M_head_impl._0_1_ =
         (internal)
         (e.stack_.c.
          super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_node ==
         (_Map_pointer)
         e.stack_.c.
         super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
         ._M_impl.super__Deque_impl_data._M_map_size);
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&e.keybuf_.off,(internal *)&local_50,(AssertionResult *)"it.valid()","true"
               ,"false",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x173,(char *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off) != &local_60) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off),
                      local_60._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  local_50._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (CONCAT71(local_50._M_head_impl._1_7_,local_29[0]) ^ 1);
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_29[0] != false) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&e.keybuf_.off,(internal *)&local_50,(AssertionResult *)0x21b7a9,"true",
               "false",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x174,(char *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off) != &local_60) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off),
                      local_60._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  if ((byte *)0x100 < e.keybuf_.buf) {
    free((void *)e.keybuf_.ibuf._248_8_);
  }
  std::
  _Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
  ::~_Deque_base((_Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                  *)&e);
  local_29[0] = true;
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::iterator
            ((iterator *)
             &verifier.key_views.
              super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              *)tree);
  kVar7 = unodb::test::
          tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::make_key((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                      *)local_2e8,2);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::seek((iterator *)
                   &verifier.key_views.
                    super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(art_key_type)kVar7,local_29,
                   false);
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (e.stack_.c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_node ==
      (_Map_pointer)
      e.stack_.c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_map_size) {
    local_50._M_head_impl._0_1_ =
         (internal)
         (e.stack_.c.
          super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_node !=
         (_Map_pointer)
         e.stack_.c.
         super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
         ._M_impl.super__Deque_impl_data._M_map_size);
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&e.keybuf_.off,(internal *)&local_50,(AssertionResult *)"it.valid()",
               "false","true",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x17c,(char *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off) != &local_60) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off),
                      local_60._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  local_50._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (CONCAT71(local_50._M_head_impl._1_7_,local_29[0]) ^ 1);
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_29[0] != false) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&e.keybuf_.off,(internal *)&local_50,(AssertionResult *)0x21b7a9,"true",
               "false",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x17d,(char *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off) != &local_60) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off),
                      local_60._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  kVar7 = unodb::
          db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          ::iterator::get_key((iterator *)
                              &verifier.key_views.
                               super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  uVar1 = *(undefined8 *)kVar7._M_ptr;
  local_50._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)uVar1 >> 0x38 | (ulong)(uVar1 & 0xff000000000000) >> 0x28 |
        (ulong)(uVar1 & 0xff0000000000) >> 0x18 | (ulong)(uVar1 & 0xff00000000) >> 8 |
        (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28 |
       uVar1 << 0x38);
  local_38.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&e.keybuf_.off,"(decode(it.get_key()))","(1)",(unsigned_long *)&local_50,
             (int *)&local_38);
  if ((char)e.keybuf_.off == '\0') {
    testing::Message::Message((Message *)&local_50);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x17e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  vVar8 = unodb::
          db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          ::iterator::get_val((iterator *)
                              &verifier.key_views.
                               super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (vVar8._M_extent._M_extent_value._M_extent_value == 2) {
    lVar3 = 0;
    do {
      if (vVar8._M_ptr[lVar3] != (&unodb::test::test_value_2)[lVar3]) goto LAB_0015e309;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 2);
  }
  else {
LAB_0015e309:
    local_50._M_head_impl = local_50._M_head_impl & 0xffffffffffffff00;
    local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&e.keybuf_.off,(internal *)&local_50,
               (AssertionResult *)"std::ranges::equal(it.get_val(), unodb::test::test_values[1])",
               "false","true",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x180,(char *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off) != &local_60) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off),
                      local_60._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::next((iterator *)
                   &verifier.key_views.
                    super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_50._M_head_impl._0_1_ =
       (internal)
       (e.stack_.c.
        super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_node ==
       (_Map_pointer)
       e.stack_.c.
       super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
       ._M_impl.super__Deque_impl_data._M_map_size);
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (e.stack_.c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_node !=
      (_Map_pointer)
      e.stack_.c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_map_size) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&e.keybuf_.off,(internal *)&local_50,(AssertionResult *)"it.valid()","true"
               ,"false",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x182,(char *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off) != &local_60) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(e.keybuf_.off._1_7_,(char)e.keybuf_.off),
                      local_60._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  if ((byte *)0x100 < e.keybuf_.buf) {
    free((void *)e.keybuf_.ibuf._248_8_);
  }
  std::
  _Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
  ::~_Deque_base((_Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                  *)&e);
  if (verifier._232_8_ != 0) {
    operator_delete((void *)verifier._232_8_,
                    (long)verifier.key_views.
                          super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - verifier._232_8_);
  }
  std::
  _Rb_tree<std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>,_std::_Select1st<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_unodb::test::tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>,_std::_Select1st<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_unodb::test::tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
               *)&verifier.test_db.mutex.super___mutex_base._M_mutex.__data.__list.__next);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::~db((db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
         *)tree);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTIteratorTest, singleLeafSeek) {
  using Key = typename TypeParam::key_type;
  unodb::test::tree_verifier<TypeParam> verifier;
  TypeParam& db = verifier.get_db();  // reference to test db instance.
  verifier.insert(1, unodb::test::test_values[1]);
  {  // exact match, forward traversal (GTE)
    auto e = db.test_only_iterator();
    bool match = false;
    auto& it = e.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(1)},
                      match, true /*fwd*/);
    UNODB_EXPECT_TRUE(it.valid());
    UNODB_EXPECT_EQ(match, true);
    UNODB_EXPECT_EQ(decode(it.get_key()), 1);
    UNODB_EXPECT_TRUE(
        std::ranges::equal(it.get_val(), unodb::test::test_values[1]));
    it.next();
    UNODB_EXPECT_FALSE(it.valid());
  }
  {  // exact match, reverse traversal (LTE)
    auto e = db.test_only_iterator();
    bool match = false;
    auto& it = e.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(1)},
                      match, false /*fwd*/);
    UNODB_EXPECT_TRUE(it.valid());
    UNODB_EXPECT_TRUE(match);
    UNODB_EXPECT_EQ(decode(it.get_key()), 1);
    UNODB_EXPECT_TRUE(
        std::ranges::equal(it.get_val(), unodb::test::test_values[1]));
    it.next();
    UNODB_EXPECT_FALSE(it.valid());  // nothing more in the iterator.
  }
  {  // forward traversal, before the first key in the data.
    // match=false and iterator is positioned on the first key in the
    // data.
    bool match = true;
    auto it = db.test_only_iterator();
    it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(0)}, match,
            true /*fwd*/);
    UNODB_EXPECT_TRUE(it.valid());
    UNODB_EXPECT_FALSE(match);
    UNODB_EXPECT_EQ(decode(it.get_key()), 1);
    UNODB_EXPECT_TRUE(
        std::ranges::equal(it.get_val(), unodb::test::test_values[1]));
    it.next();
    UNODB_EXPECT_FALSE(it.valid());
  }
  {  // forward traversal, after the last key in the data.  match=false
    // and iterator is invalidated.
    bool match = true;
    auto it = db.test_only_iterator();
    it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(2)}, match,
            true /*fwd*/);
    UNODB_EXPECT_FALSE(it.valid());
    UNODB_EXPECT_FALSE(match);
  }
  {  // reverse traversal, before the first key in the data.
    // match=false and iterator is invalidated.
    bool match = true;
    auto it = db.test_only_iterator();
    it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(0)}, match,
            false /*fwd*/);
    UNODB_EXPECT_FALSE(it.valid());
    UNODB_EXPECT_FALSE(match);
  }
  {  // reverse traversal, after the last key in the data.  match=false
    // and iterator is positioned at the last key.
    bool match = true;
    auto it = db.test_only_iterator();
    it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(2)}, match,
            false /*fwd*/);
    UNODB_EXPECT_TRUE(it.valid());
    UNODB_EXPECT_FALSE(match);
    UNODB_EXPECT_EQ(decode(it.get_key()), 1);
    UNODB_EXPECT_TRUE(
        std::ranges::equal(it.get_val(), unodb::test::test_values[1]));
    it.next();
    UNODB_EXPECT_FALSE(it.valid());
  }
}